

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFloatStateQueryTests.cpp
# Opt level: O0

void __thiscall deqp::gles3::Functional::anon_unknown_2::DepthClearCase::test(DepthClearCase *this)

{
  float d;
  int local_34;
  GLfloat ref;
  int i;
  int numIterations;
  undefined1 local_20 [8];
  Random rnd;
  DepthClearCase *this_local;
  
  rnd.m_rnd._8_8_ = this;
  de::Random::Random((Random *)local_20,0xabcdef);
  (*this->m_verifier->_vptr_StateVerifier[3])
            (0x3f800000,this->m_verifier,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0xb73);
  ApiCase::expectError(&this->super_ApiCase,0);
  for (local_34 = 0; local_34 < 0x78; local_34 = local_34 + 1) {
    d = de::Random::getFloat((Random *)local_20,0.0,1.0);
    glu::CallLogWrapper::glClearDepthf(&(this->super_ApiCase).super_CallLogWrapper,d);
    (*this->m_verifier->_vptr_StateVerifier[3])
              (d,this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0xb73);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  de::Random::~Random((Random *)local_20);
  return;
}

Assistant:

void test (void)
	{
		de::Random rnd(0xabcdef);

		m_verifier->verifyFloatExpanded(m_testCtx, GL_DEPTH_CLEAR_VALUE, 1);
		expectError(GL_NO_ERROR);

		const int numIterations = 120;
		for (int i = 0; i < numIterations; ++i)
		{
			const GLfloat ref = rnd.getFloat(0, 1);

			glClearDepthf(ref);
			m_verifier->verifyFloatExpanded(m_testCtx, GL_DEPTH_CLEAR_VALUE, ref);
			expectError(GL_NO_ERROR);
		}
	}